

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

bool pugi::impl::anon_unknown_0::allow_move(xml_node parent,xml_node child)

{
  xml_node xVar1;
  uint uVar2;
  xml_node_struct *in_RAX;
  uint uVar3;
  bool bVar4;
  xml_node local_38;
  
  if (parent._root == (xml_node_struct *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (uint)(parent._root)->header & 0xf;
  }
  if (((child._root == (xml_node_struct *)0x0) ||
      (uVar3 = (uint)(child._root)->header & 0xf, uVar3 < 2 || uVar2 - 3 < 0xfffffffe)) ||
     (uVar2 != 1 && 0xfffffffd < uVar3 - 9)) {
    bVar4 = false;
  }
  else {
    local_38._root = in_RAX;
    if (parent._root == (xml_node_struct *)0x0) {
      xml_node::xml_node(&local_38);
    }
    else {
      xml_node::xml_node(&local_38,
                         (xml_node_struct *)
                         (*(long *)((long)parent._root - ((parent._root)->header >> 8)) + -0x40));
    }
    xVar1._root = local_38._root;
    xml_node::xml_node(&local_38,
                       (xml_node_struct *)
                       (*(long *)((long)child._root - ((child._root)->header >> 8)) + -0x40));
    bVar4 = xVar1._root == local_38._root;
    if (bVar4 && parent._root != (xml_node_struct *)0x0) {
      do {
        bVar4 = parent._root != child._root;
        if (parent._root == child._root) {
          return bVar4;
        }
        xml_node::xml_node(&local_38,(parent._root)->parent);
        parent._root = local_38._root;
      } while (local_38._root != (xml_node_struct *)0x0);
    }
  }
  return bVar4;
}

Assistant:

PUGI__FN bool allow_move(xml_node parent, xml_node child)
	{
		// check that child can be a child of parent
		if (!allow_insert_child(parent.type(), child.type()))
			return false;

		// check that node is not moved between documents
		if (parent.root() != child.root())
			return false;

		// check that new parent is not in the child subtree
		xml_node cur = parent;

		while (cur)
		{
			if (cur == child)
				return false;

			cur = cur.parent();
		}

		return true;
	}